

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList>::copy
          (SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  size_type sVar1;
  pointer ppEVar2;
  undefined8 uVar3;
  Expression *pEVar4;
  byte *pbVar5;
  byte *pbVar6;
  pointer pTVar7;
  byte *pbVar8;
  pointer pTVar9;
  byte *pbVar10;
  
  sVar1 = this->len;
  if (sVar1 == 0) {
    return 0;
  }
  pbVar5 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  pbVar8 = pbVar5 + sVar1 * 0x28;
  if (*(byte **)(dst + 8) < pbVar8) {
    pbVar6 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar1 * 0x28,8);
    sVar1 = this->len;
    if (sVar1 == 0) goto LAB_001e290c;
    pTVar7 = this->data_;
    pTVar9 = pTVar7 + sVar1;
    pbVar8 = pbVar6 + sVar1 * 0x28;
    pbVar5 = pbVar6;
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar8;
    pTVar7 = this->data_;
    pTVar9 = pTVar7 + sVar1;
    pbVar6 = pbVar5;
  }
  do {
    pbVar10 = pbVar5 + 0x28;
    *(undefined8 *)(pbVar5 + 0x20) = *(undefined8 *)&pTVar7->repeatKind;
    ppEVar2 = (pTVar7->items)._M_ptr;
    uVar3 = (pTVar7->items)._M_extent._M_extent_value;
    pEVar4 = pTVar7->repeatTo;
    *(Expression **)(pbVar5 + 0x10) = pTVar7->repeatFrom;
    *(Expression **)(pbVar5 + 0x18) = pEVar4;
    *(pointer *)pbVar5 = ppEVar2;
    *(undefined8 *)(pbVar5 + 8) = uVar3;
    if (pTVar7 + 1 == pTVar9) break;
    pTVar7 = pTVar7 + 1;
    pbVar5 = pbVar10;
  } while (pbVar10 != pbVar8);
LAB_001e290c:
  return (int)pbVar6;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }